

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBase.cpp
# Opt level: O0

void Diligent::ValidatedAndCorrectTextureViewDesc(TextureDesc *TexDesc,TextureViewDesc *ViewDesc)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined *puVar4;
  TextureViewDesc *Args_3;
  bool bVar5;
  TEXTURE_VIEW_FLAGS TVar6;
  MISC_TEXTURE_FLAGS MVar7;
  TEXTURE_FORMAT TVar8;
  BIND_FLAGS BVar9;
  Char *pCVar10;
  TextureFormatAttribs *pTVar11;
  undefined8 uVar12;
  uint uVar13;
  uint *puVar14;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_250;
  char *local_230;
  char *local_228;
  char *local_200;
  char *local_1e8;
  char *local_1e0;
  undefined1 local_1d8 [8];
  string _msg;
  char *FmtName;
  uint local_1a8;
  uint local_1a4;
  char *pcStack_1a0;
  Uint32 MipDepth_1;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 local_178 [8];
  string msg_2;
  uint local_14c;
  uint local_148;
  uint local_144;
  char *pcStack_140;
  Uint32 MipDepth;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 local_118 [8];
  string msg_1;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8 [3];
  undefined1 local_a0 [8];
  string msg;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  TextureViewDesc *local_40;
  TextureViewDesc *ViewDesc_local;
  TextureDesc *TexDesc_local;
  
  local_40 = ViewDesc;
  ViewDesc_local = (TextureViewDesc *)TexDesc;
  if ((ViewDesc->ViewType == TEXTURE_VIEW_UNDEFINED) ||
     (TEXTURE_VIEW_SHADING_RATE < ViewDesc->ViewType)) {
    if ((ViewDesc->super_DeviceObjectAttribs).Name == (Char *)0x0) {
      local_1e0 = "";
    }
    else {
      local_1e0 = (ViewDesc->super_DeviceObjectAttribs).Name;
    }
    local_48 = local_1e0;
    LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[36]>
              (false,"ValidatedAndCorrectTextureViewDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x1e8,(char (*) [50])"\n                 Failed to create texture view \'",&local_48
               ,(char (*) [16])"\' for texture \'",(char **)TexDesc,(char (*) [4])"\': ",
               (char (*) [36])"Texture view type is not specified.");
  }
  uVar13._0_1_ = ViewDesc_local->AccessFlags;
  uVar13._1_1_ = ViewDesc_local->Flags;
  uVar13._2_1_ = (ViewDesc_local->Swizzle).R;
  uVar13._3_1_ = (ViewDesc_local->Swizzle).G;
  if (uVar13 <= local_40->MostDetailedMip) {
    if ((local_40->super_DeviceObjectAttribs).Name == (Char *)0x0) {
      local_1e8 = "";
    }
    else {
      local_1e8 = (local_40->super_DeviceObjectAttribs).Name;
    }
    local_50 = local_1e8;
    uVar2._0_1_ = ViewDesc_local->AccessFlags;
    uVar2._1_1_ = ViewDesc_local->Flags;
    uVar2._2_1_ = (ViewDesc_local->Swizzle).R;
    uVar2._3_1_ = (ViewDesc_local->Swizzle).G;
    local_58 = "level.";
    if (1 < uVar2) {
      local_58 = "levels.";
    }
    LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[20],unsigned_int,char[41],unsigned_int,char[6],char_const*>
              (false,"ValidatedAndCorrectTextureViewDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x1eb,(char (*) [50])"\n                 Failed to create texture view \'",&local_50
               ,(char (*) [16])"\' for texture \'",(char **)ViewDesc_local,(char (*) [4])"\': ",
               (char (*) [20])"Most detailed mip (",&local_40->MostDetailedMip,
               (char (*) [41])") is out of range. The texture has only ",
               (uint *)&ViewDesc_local->AccessFlags,(char (*) [6])0xf4c88c,&local_58);
  }
  if ((local_40->NumMipLevels != 0xffffffff) &&
     (uVar1._0_1_ = ViewDesc_local->AccessFlags, uVar1._1_1_ = ViewDesc_local->Flags,
     uVar1._2_1_ = (ViewDesc_local->Swizzle).R, uVar1._3_1_ = (ViewDesc_local->Swizzle).G,
     uVar1 < local_40->MostDetailedMip + local_40->NumMipLevels)) {
    if ((local_40->super_DeviceObjectAttribs).Name == (Char *)0x0) {
      local_200 = "";
    }
    else {
      local_200 = (local_40->super_DeviceObjectAttribs).Name;
    }
    local_60 = local_200;
    uVar3._0_1_ = ViewDesc_local->AccessFlags;
    uVar3._1_1_ = ViewDesc_local->Flags;
    uVar3._2_1_ = (ViewDesc_local->Swizzle).R;
    uVar3._3_1_ = (ViewDesc_local->Swizzle).G;
    local_68 = "level.";
    if (1 < uVar3) {
      local_68 = "levels.";
    }
    LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[20],unsigned_int,char[41],unsigned_int,char[41],unsigned_int,char[6],char_const*>
              (false,"ValidatedAndCorrectTextureViewDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x1ee,(char (*) [50])"\n                 Failed to create texture view \'",&local_60
               ,(char (*) [16])"\' for texture \'",(char **)ViewDesc_local,(char (*) [4])"\': ",
               (char (*) [20])"Most detailed mip (",&local_40->MostDetailedMip,
               (char (*) [41])") and number of mip levels in the view (",&local_40->NumMipLevels,
               (char (*) [41])") is out of range. The texture has only ",
               (uint *)&ViewDesc_local->AccessFlags,(char (*) [6])0xf4c88c,&local_68);
  }
  if (local_40->Format == TEX_FORMAT_UNKNOWN) {
    TVar8 = GetDefaultTextureViewFormat
                      (*(TEXTURE_FORMAT *)&ViewDesc_local->field_6,local_40->ViewType,
                       *(Uint32 *)&ViewDesc_local->field_0x24);
    local_40->Format = TVar8;
  }
  bVar5 = TextureDesc::IsArray((TextureDesc *)ViewDesc_local);
  if (bVar5) {
    if ((ViewDesc_local->field_5).FirstArraySlice <= (local_40->field_5).FirstArraySlice) {
      if ((local_40->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_228 = "";
      }
      else {
        local_228 = (local_40->super_DeviceObjectAttribs).Name;
      }
      local_70 = local_228;
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[20],unsigned_int,char[42],unsigned_int,char[10]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x1f6,(char (*) [50])"\n                 Failed to create texture view \'",
                 &local_70,(char (*) [16])"\' for texture \'",(char **)ViewDesc_local,
                 (char (*) [4])"\': ",(char (*) [20])"First array slice (",
                 &(local_40->field_5).FirstArraySlice,
                 (char (*) [42])") is out of range. The texture has only (",
                 &(ViewDesc_local->field_5).FirstArraySlice,(char (*) [10])") slices.");
    }
    if (((local_40->field_6).NumArraySlices != 0xffffffff) &&
       ((ViewDesc_local->field_5).FirstArraySlice <
        (local_40->field_5).FirstArraySlice + (local_40->field_6).NumArraySlices)) {
      if ((local_40->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_230 = "";
      }
      else {
        local_230 = (local_40->super_DeviceObjectAttribs).Name;
      }
      local_78 = local_230;
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[20],unsigned_int,char[31],unsigned_int,char[42],unsigned_int,char[10]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x1fa,(char (*) [50])"\n                 Failed to create texture view \'",
                 &local_78,(char (*) [16])"\' for texture \'",(char **)ViewDesc_local,
                 (char (*) [4])"\': ",(char (*) [20])"First array slice (",
                 &(local_40->field_5).FirstArraySlice,
                 (char (*) [31])") and number of array slices (",&(local_40->field_6).NumArraySlices
                 ,(char (*) [42])") is out of range. The texture has only (",
                 &(ViewDesc_local->field_5).FirstArraySlice,(char (*) [10])") slices.");
    }
  }
  else {
    bVar5 = TextureDesc::Is3D((TextureDesc *)ViewDesc_local);
    if ((!bVar5) && ((local_40->field_5).FirstArraySlice != 0)) {
      if ((local_40->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_250 = "";
      }
      else {
        local_250 = (local_40->super_DeviceObjectAttribs).Name;
      }
      msg.field_2._8_8_ = local_250;
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[48]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x1ff,(char (*) [50])"\n                 Failed to create texture view \'",
                 (char **)((long)&msg.field_2 + 8),(char (*) [16])"\' for texture \'",
                 (char **)ViewDesc_local,(char (*) [4])"\': ",
                 (char (*) [48])"For non-array texture FirstArraySlice must be 0");
    }
  }
  if (local_40->TextureDim == RESOURCE_DIM_UNDEFINED) {
    if ((ViewDesc_local->ViewType == TEXTURE_VIEW_NUM_VIEWS) || (ViewDesc_local->ViewType == 8)) {
      if (local_40->ViewType == 1) {
        local_40->TextureDim = ViewDesc_local->ViewType;
      }
      else if (local_40->ViewType - 2 < 4) {
        local_40->TextureDim = RESOURCE_DIM_TEX_2D_ARRAY;
      }
      else {
        FormatString<char[21]>((string *)local_a0,(char (*) [21])"Unexpected view type");
        pCVar10 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar10,"ValidatedAndCorrectTextureViewDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                   ,0x213);
        std::__cxx11::string::~string((string *)local_a0);
      }
    }
    else {
      local_40->TextureDim = ViewDesc_local->ViewType;
    }
  }
  switch(ViewDesc_local->ViewType) {
  case TEXTURE_VIEW_RENDER_TARGET:
    if (local_40->TextureDim != RESOURCE_DIM_TEX_1D) {
      if ((local_40->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_270 = "";
      }
      else {
        local_270 = (local_40->super_DeviceObjectAttribs).Name;
      }
      local_b8[0] = local_270;
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[72]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x221,(char (*) [50])"\n                 Failed to create texture view \'",
                 local_b8,(char (*) [16])"\' for texture \'",(char **)ViewDesc_local,
                 (char (*) [4])"\': ",
                 (char (*) [72])
                 "Incorrect texture type for Texture 1D view: only Texture 1D is allowed.");
    }
    break;
  case TEXTURE_VIEW_DEPTH_STENCIL:
    if ((local_40->TextureDim != RESOURCE_DIM_TEX_1D_ARRAY) &&
       (local_40->TextureDim != RESOURCE_DIM_TEX_1D)) {
      if ((local_40->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_278 = "";
      }
      else {
        local_278 = (local_40->super_DeviceObjectAttribs).Name;
      }
      local_c0 = local_278;
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[91]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x229,(char (*) [50])"\n                 Failed to create texture view \'",
                 &local_c0,(char (*) [16])"\' for texture \'",(char **)ViewDesc_local,
                 (char (*) [4])"\': ",
                 (char (*) [91])
                 "Incorrect view type for Texture 1D Array: only Texture 1D or Texture 1D Array are allowed."
                );
    }
    break;
  case TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL:
    if ((local_40->TextureDim != RESOURCE_DIM_TEX_2D_ARRAY) &&
       (local_40->TextureDim != RESOURCE_DIM_TEX_2D)) {
      if ((local_40->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_280 = "";
      }
      else {
        local_280 = (local_40->super_DeviceObjectAttribs).Name;
      }
      local_c8 = local_280;
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[93]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x231,(char (*) [50])"\n                 Failed to create texture view \'",
                 &local_c8,(char (*) [16])"\' for texture \'",(char **)ViewDesc_local,
                 (char (*) [4])"\': ",
                 (char (*) [93])
                 "Incorrect texture type for Texture 2D view: only Texture 2D or Texture 2D Array are allowed."
                );
    }
    break;
  case TEXTURE_VIEW_UNORDERED_ACCESS:
    if ((local_40->TextureDim != RESOURCE_DIM_TEX_2D_ARRAY) &&
       (local_40->TextureDim != RESOURCE_DIM_TEX_2D)) {
      if ((local_40->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_288 = "";
      }
      else {
        local_288 = (local_40->super_DeviceObjectAttribs).Name;
      }
      local_d0 = local_288;
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[99]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x239,(char (*) [50])"\n                 Failed to create texture view \'",
                 &local_d0,(char (*) [16])"\' for texture \'",(char **)ViewDesc_local,
                 (char (*) [4])"\': ",
                 (char (*) [99])
                 "Incorrect texture type for Texture 2D Array view: only Texture 2D or Texture 2D Array are allowed."
                );
    }
    break;
  case TEXTURE_VIEW_SHADING_RATE:
    if (local_40->TextureDim != RESOURCE_DIM_TEX_3D) {
      if ((local_40->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_290 = "";
      }
      else {
        local_290 = (local_40->super_DeviceObjectAttribs).Name;
      }
      local_d8 = local_290;
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[72]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x240,(char (*) [50])"\n                 Failed to create texture view \'",
                 &local_d8,(char (*) [16])"\' for texture \'",(char **)ViewDesc_local,
                 (char (*) [4])"\': ",
                 (char (*) [72])
                 "Incorrect texture type for Texture 3D view: only Texture 3D is allowed.");
    }
    break;
  case TEXTURE_VIEW_NUM_VIEWS:
    if (local_40->ViewType == TEXTURE_VIEW_SHADER_RESOURCE) {
      if (((local_40->TextureDim != RESOURCE_DIM_TEX_2D) &&
          (local_40->TextureDim != RESOURCE_DIM_TEX_2D_ARRAY)) &&
         (local_40->TextureDim != RESOURCE_DIM_TEX_CUBE)) {
        if ((local_40->super_DeviceObjectAttribs).Name == (Char *)0x0) {
          local_298 = "";
        }
        else {
          local_298 = (local_40->super_DeviceObjectAttribs).Name;
        }
        local_e0 = local_298;
        LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[102]>
                  (false,"ValidatedAndCorrectTextureViewDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                   ,0x24b,(char (*) [50])"\n                 Failed to create texture view \'",
                   &local_e0,(char (*) [16])"\' for texture \'",(char **)ViewDesc_local,
                   (char (*) [4])"\': ",
                   (char (*) [102])
                   "Incorrect texture type for Texture cube SRV: Texture 2D, Texture 2D array or Texture Cube is allowed."
                  );
      }
    }
    else if ((local_40->TextureDim != RESOURCE_DIM_TEX_2D) &&
            (local_40->TextureDim != RESOURCE_DIM_TEX_2D_ARRAY)) {
      if ((local_40->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_2a0 = "";
      }
      else {
        local_2a0 = (local_40->super_DeviceObjectAttribs).Name;
      }
      local_e8 = local_2a0;
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[109]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x253,(char (*) [50])"\n                 Failed to create texture view \'",
                 &local_e8,(char (*) [16])"\' for texture \'",(char **)ViewDesc_local,
                 (char (*) [4])"\': ",
                 (char (*) [109])
                 "Incorrect texture type for Texture cube non-shader resource view: Texture 2D or Texture 2D array is allowed."
                );
    }
    break;
  case 8:
    if (local_40->ViewType == TEXTURE_VIEW_SHADER_RESOURCE) {
      if ((((local_40->TextureDim != RESOURCE_DIM_TEX_2D) &&
           (local_40->TextureDim != RESOURCE_DIM_TEX_2D_ARRAY)) &&
          (local_40->TextureDim != RESOURCE_DIM_TEX_CUBE)) &&
         (local_40->TextureDim != RESOURCE_DIM_TEX_CUBE_ARRAY)) {
        if ((local_40->super_DeviceObjectAttribs).Name == (Char *)0x0) {
          local_2a8 = "";
        }
        else {
          local_2a8 = (local_40->super_DeviceObjectAttribs).Name;
        }
        local_f0 = local_2a8;
        LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[128]>
                  (false,"ValidatedAndCorrectTextureViewDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                   ,0x260,(char (*) [50])"\n                 Failed to create texture view \'",
                   &local_f0,(char (*) [16])"\' for texture \'",(char **)ViewDesc_local,
                   (char (*) [4])"\': ",
                   (char (*) [128])
                   "Incorrect texture type for Texture cube array SRV: Texture 2D, Texture 2D array, Texture Cube or Texture Cube Array is allowed."
                  );
      }
    }
    else if ((local_40->TextureDim != RESOURCE_DIM_TEX_2D) &&
            (local_40->TextureDim != RESOURCE_DIM_TEX_2D_ARRAY)) {
      if ((local_40->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_2b0 = "";
      }
      else {
        local_2b0 = (local_40->super_DeviceObjectAttribs).Name;
      }
      msg_1.field_2._8_8_ = local_2b0;
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[115]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x268,(char (*) [50])"\n                 Failed to create texture view \'",
                 (char **)((long)&msg_1.field_2 + 8),(char (*) [16])"\' for texture \'",
                 (char **)ViewDesc_local,(char (*) [4])"\': ",
                 (char (*) [115])
                 "Incorrect texture type for Texture cube array non-shader resource view: Texture 2D or Texture 2D array is allowed."
                );
    }
    break;
  default:
    FormatString<char[24]>((string *)local_118,(char (*) [24])"Unexpected texture type");
    pCVar10 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar10,"ValidatedAndCorrectTextureViewDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x26e);
    std::__cxx11::string::~string((string *)local_118);
  }
  puVar14 = &switchD_00c74b12::switchdataD_00f55954;
  switch(local_40->TextureDim) {
  case RESOURCE_DIM_TEX_1D:
  case RESOURCE_DIM_TEX_2D:
    if (((local_40->field_6).NumArraySlices != 0xffffffff) &&
       (1 < (local_40->field_6).NumArraySlices)) {
      if ((local_40->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_2e8 = "";
      }
      else {
        local_2e8 = (local_40->super_DeviceObjectAttribs).Name;
      }
      pcStack_140 = local_2e8;
      puVar14 = (uint *)0x285;
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[31],unsigned_int,char[54]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x285,(char (*) [50])"\n                 Failed to create texture view \'",
                 &stack0xfffffffffffffec0,(char (*) [16])"\' for texture \'",(char **)ViewDesc_local
                 ,(char (*) [4])"\': ",(char (*) [31])"Number of slices in the view (",
                 &(local_40->field_6).NumArraySlices,
                 (char (*) [54])") must be 1 (or 0) for non-array texture 1D/2D views.");
    }
    break;
  case RESOURCE_DIM_TEX_1D_ARRAY:
  case RESOURCE_DIM_TEX_2D_ARRAY:
    break;
  case RESOURCE_DIM_TEX_3D:
    local_148 = (ViewDesc_local->field_5).FirstArraySlice >>
                ((byte)local_40->MostDetailedMip & 0x1f);
    local_14c = 1;
    puVar14 = std::max<unsigned_int>(&local_148,&local_14c);
    local_144 = *puVar14;
    puVar14 = (uint *)local_40;
    if (local_144 < (local_40->field_5).FirstArraySlice + (local_40->field_6).NumArraySlices) {
      if ((local_40->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_2f0 = "";
      }
      else {
        local_2f0 = (local_40->super_DeviceObjectAttribs).Name;
      }
      msg_2.field_2._8_8_ = local_2f0;
      puVar14 = (uint *)0x290;
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[14],unsigned_int,char[37],unsigned_int,char[61],unsigned_int,char[3]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x290,(char (*) [50])"\n                 Failed to create texture view \'",
                 (char **)((long)&msg_2.field_2 + 8),(char (*) [16])"\' for texture \'",
                 (char **)ViewDesc_local,(char (*) [4])"\': ",(char (*) [14])"First slice (",
                 &(local_40->field_5).FirstArraySlice,
                 (char (*) [37])") and number of slices in the view (",
                 &(local_40->field_6).NumArraySlices,
                 (char (*) [61])") specify more slices than target 3D texture mip level has (",
                 &local_144,(char (*) [3])0xf65ced);
    }
    break;
  case RESOURCE_DIM_TEX_CUBE:
    if (local_40->ViewType != TEXTURE_VIEW_SHADER_RESOURCE) {
      if ((local_40->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_2c8 = "";
      }
      else {
        local_2c8 = (local_40->super_DeviceObjectAttribs).Name;
      }
      local_120 = local_2c8;
      puVar14 = (uint *)0x276;
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[39]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x276,(char (*) [50])"\n                 Failed to create texture view \'",
                 &local_120,(char (*) [16])"\' for texture \'",(char **)ViewDesc_local,
                 (char (*) [4])"\': ",(char (*) [39])"Unexpected view type: SRV is expected.");
    }
    if ((((local_40->field_6).NumArraySlices != 6) && ((local_40->field_6).NumArraySlices != 0)) &&
       ((local_40->field_6).NumArraySlices != 0xffffffff)) {
      if ((local_40->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_2d0 = "";
      }
      else {
        local_2d0 = (local_40->super_DeviceObjectAttribs).Name;
      }
      local_128 = local_2d0;
      puVar14 = (uint *)0x278;
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[60],unsigned_int,char[14]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x278,(char (*) [50])"\n                 Failed to create texture view \'",
                 &local_128,(char (*) [16])"\' for texture \'",(char **)ViewDesc_local,
                 (char (*) [4])"\': ",
                 (char (*) [60])"Texture cube SRV is expected to have 6 array slices, while ",
                 &(local_40->field_6).NumArraySlices,(char (*) [14])0xf572fb);
    }
    break;
  case RESOURCE_DIM_TEX_CUBE_ARRAY:
    if (local_40->ViewType != TEXTURE_VIEW_SHADER_RESOURCE) {
      if ((local_40->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_2d8 = "";
      }
      else {
        local_2d8 = (local_40->super_DeviceObjectAttribs).Name;
      }
      local_130 = local_2d8;
      puVar14 = (uint *)0x27d;
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[39]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x27d,(char (*) [50])"\n                 Failed to create texture view \'",
                 &local_130,(char (*) [16])"\' for texture \'",(char **)ViewDesc_local,
                 (char (*) [4])"\': ",(char (*) [39])"Unexpected view type: SRV is expected.");
    }
    if (((local_40->field_6).NumArraySlices != 0xffffffff) &&
       (puVar14 = (uint *)(TextureViewDesc *)0x6, (local_40->field_6).NumArraySlices % 6 != 0)) {
      if ((local_40->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_2e0 = "";
      }
      else {
        local_2e0 = (local_40->super_DeviceObjectAttribs).Name;
      }
      local_138 = local_2e0;
      puVar14 = (uint *)0x27f;
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[77],unsigned_int,char[21]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x27f,(char (*) [50])"\n                 Failed to create texture view \'",
                 &local_138,(char (*) [16])"\' for texture \'",(char **)ViewDesc_local,
                 (char (*) [4])"\': ",
                 (char (*) [77])
                 "Number of slices in texture cube array SRV is expected to be multiple of 6. ",
                 &(local_40->field_6).NumArraySlices,(char (*) [21])" slices is provided.");
    }
    break;
  default:
    FormatString<char[29]>((string *)local_178,(char (*) [29])"Unexpected texture dimension");
    pCVar10 = (Char *)std::__cxx11::string::c_str();
    puVar14 = (uint *)0x295;
    DebugAssertionFailed
              (pCVar10,"ValidatedAndCorrectTextureViewDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x295);
    std::__cxx11::string::~string((string *)local_178);
  }
  pTVar11 = GetTextureFormatAttribs(local_40->Format);
  Args_3 = ViewDesc_local;
  if ((pTVar11->IsTypeless & 1U) != 0) {
    if ((local_40->super_DeviceObjectAttribs).Name == (Char *)0x0) {
      local_318 = "";
    }
    else {
      local_318 = (local_40->super_DeviceObjectAttribs).Name;
    }
    local_180 = local_318;
    pTVar11 = GetTextureFormatAttribs(local_40->Format);
    puVar14 = (uint *)0x29a;
    LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[22],char_const*,char[22]>
              (false,"ValidatedAndCorrectTextureViewDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x29a,(char (*) [50])"\n                 Failed to create texture view \'",
               &local_180,(char (*) [16])"\' for texture \'",(char **)Args_3,(char (*) [4])"\': ",
               (char (*) [22])"Texture view format (",&pTVar11->Name,
               (char (*) [22])") cannot be typeless.");
  }
  TVar6 = operator&(local_40->Flags,TEXTURE_VIEW_FLAG_ALLOW_MIP_MAP_GENERATION);
  if (TVar6 != TEXTURE_VIEW_FLAG_NONE) {
    MVar7 = operator&(*(MISC_TEXTURE_FLAGS *)
                       ((long)&ViewDesc_local[1].super_DeviceObjectAttribs.Name + 2),
                      MISC_TEXTURE_FLAG_GENERATE_MIPS);
    if (MVar7 == MISC_TEXTURE_FLAG_NONE) {
      if ((local_40->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_320 = "";
      }
      else {
        local_320 = (local_40->super_DeviceObjectAttribs).Name;
      }
      local_188 = local_320;
      puVar14 = (uint *)0x2a0;
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[131]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x2a0,(char (*) [50])"\n                 Failed to create texture view \'",
                 &local_188,(char (*) [16])"\' for texture \'",(char **)ViewDesc_local,
                 (char (*) [4])"\': ",
                 (char (*) [131])
                 "TEXTURE_VIEW_FLAG_ALLOW_MIP_MAP_GENERATION flag can only set if the texture was created with MISC_TEXTURE_FLAG_GENERATE_MIPS flag."
                );
    }
    if (local_40->ViewType != TEXTURE_VIEW_SHADER_RESOURCE) {
      if ((local_40->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_328 = "";
      }
      else {
        local_328 = (local_40->super_DeviceObjectAttribs).Name;
      }
      local_190 = local_328;
      puVar14 = (uint *)0x2a3;
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[110]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x2a3,(char (*) [50])"\n                 Failed to create texture view \'",
                 &local_190,(char (*) [16])"\' for texture \'",(char **)ViewDesc_local,
                 (char (*) [4])"\': ",
                 (char (*) [110])
                 "TEXTURE_VIEW_FLAG_ALLOW_MIP_MAP_GENERATION flag can only be used with TEXTURE_VIEW_SHADER_RESOURCE view type."
                );
    }
  }
  if ((local_40->ViewType == TEXTURE_VIEW_SHADING_RATE) &&
     (BVar9 = operator&(*(BIND_FLAGS *)&ViewDesc_local->field_0x24,BIND_FLAG_LAST),
     BVar9 == BIND_NONE)) {
    if ((local_40->super_DeviceObjectAttribs).Name == (Char *)0x0) {
      local_330 = "";
    }
    else {
      local_330 = (local_40->super_DeviceObjectAttribs).Name;
    }
    local_198 = local_330;
    puVar14 = (uint *)0x2a9;
    LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[94]>
              (false,"ValidatedAndCorrectTextureViewDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x2a9,(char (*) [50])"\n                 Failed to create texture view \'",
               &local_198,(char (*) [16])"\' for texture \'",(char **)ViewDesc_local,
               (char (*) [4])"\': ",
               (char (*) [94])
               "To create TEXTURE_VIEW_SHADING_RATE, the texture must be created with BIND_SHADING_RATE flag."
              );
  }
  if ((local_40->ViewType != TEXTURE_VIEW_SHADER_RESOURCE) &&
     (bVar5 = IsIdentityComponentMapping(&local_40->Swizzle), !bVar5)) {
    if ((local_40->super_DeviceObjectAttribs).Name == (Char *)0x0) {
      local_338 = "";
    }
    else {
      local_338 = (local_40->super_DeviceObjectAttribs).Name;
    }
    pcStack_1a0 = local_338;
    puVar14 = (uint *)0x2ad;
    LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[84]>
              (false,"ValidatedAndCorrectTextureViewDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x2ad,(char (*) [50])"\n                 Failed to create texture view \'",
               &stack0xfffffffffffffe60,(char (*) [16])"\' for texture \'",(char **)ViewDesc_local,
               (char (*) [4])"\': ",
               (char (*) [84])
               "Non-identity texture component swizzle is only supported for shader resource views."
              );
  }
  if ((local_40->NumMipLevels == 0) || (local_40->NumMipLevels == 0xffffffff)) {
    if (local_40->ViewType == TEXTURE_VIEW_SHADER_RESOURCE) {
      uVar13 = *(int *)&ViewDesc_local->AccessFlags - local_40->MostDetailedMip;
      puVar14 = (uint *)(ulong)uVar13;
      local_40->NumMipLevels = uVar13;
    }
    else {
      local_40->NumMipLevels = 1;
    }
  }
  if (((local_40->field_6).NumArraySlices == 0) ||
     ((local_40->field_6).NumArraySlices == 0xffffffff)) {
    bVar5 = TextureDesc::IsArray((TextureDesc *)ViewDesc_local);
    if (bVar5) {
      uVar13 = (ViewDesc_local->field_5).FirstArraySlice - (local_40->field_5).FirstArraySlice;
      puVar14 = (uint *)(ulong)uVar13;
      (local_40->field_6).NumArraySlices = uVar13;
    }
    else {
      bVar5 = TextureDesc::Is3D((TextureDesc *)ViewDesc_local);
      if (bVar5) {
        local_1a8 = (ViewDesc_local->field_5).FirstArraySlice >>
                    ((byte)local_40->MostDetailedMip & 0x1f);
        FmtName._4_4_ = 1;
        puVar14 = std::max<unsigned_int>(&local_1a8,(uint *)((long)&FmtName + 4));
        local_1a4 = *puVar14;
        uVar13 = local_1a4 - (local_40->field_5).FirstArraySlice;
        puVar14 = (uint *)(ulong)uVar13;
        (local_40->field_6).NumArraySlices = uVar13;
      }
      else {
        (local_40->field_6).NumArraySlices = 1;
      }
    }
  }
  if ((local_40->ViewType == TEXTURE_VIEW_RENDER_TARGET) &&
     (((((local_40->Format == TEX_FORMAT_R8_SNORM || (local_40->Format == TEX_FORMAT_RG8_SNORM)) ||
        (local_40->Format == TEX_FORMAT_RGBA8_SNORM)) ||
       ((local_40->Format == TEX_FORMAT_R16_SNORM || (local_40->Format == TEX_FORMAT_RG16_SNORM))))
      || (local_40->Format == TEX_FORMAT_RGBA16_SNORM)))) {
    pTVar11 = GetTextureFormatAttribs(local_40->Format);
    _msg.field_2._8_8_ = pTVar11->Name;
    FormatString<char_const*,char[194]>
              ((string *)local_1d8,(Diligent *)(_msg.field_2._M_local_buf + 8),
               (char **)
               " render target view is created.\nThere might be an issue in OpenGL driver on NVidia hardware: when rendering to SNORM textures, all negative values are clamped to zero.\nUse UNORM format instead."
               ,(char (*) [194])puVar14);
    puVar4 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar12 = std::__cxx11::string::c_str();
      (*(code *)puVar4)(1,uVar12,0);
    }
    std::__cxx11::string::~string((string *)local_1d8);
  }
  return;
}

Assistant:

void ValidatedAndCorrectTextureViewDesc(const TextureDesc& TexDesc, TextureViewDesc& ViewDesc) noexcept(false)
{
#define TEX_VIEW_VALIDATION_ERROR(...) LOG_ERROR_AND_THROW("\n                 Failed to create texture view '", (ViewDesc.Name ? ViewDesc.Name : ""), "' for texture '", TexDesc.Name, "': ", ##__VA_ARGS__)

    if (!(ViewDesc.ViewType > TEXTURE_VIEW_UNDEFINED && ViewDesc.ViewType < TEXTURE_VIEW_NUM_VIEWS))
        TEX_VIEW_VALIDATION_ERROR("Texture view type is not specified.");

    if (ViewDesc.MostDetailedMip >= TexDesc.MipLevels)
        TEX_VIEW_VALIDATION_ERROR("Most detailed mip (", ViewDesc.MostDetailedMip, ") is out of range. The texture has only ", TexDesc.MipLevels, " mip ", (TexDesc.MipLevels > 1 ? "levels." : "level."));

    if (ViewDesc.NumMipLevels != REMAINING_MIP_LEVELS && ViewDesc.MostDetailedMip + ViewDesc.NumMipLevels > TexDesc.MipLevels)
        TEX_VIEW_VALIDATION_ERROR("Most detailed mip (", ViewDesc.MostDetailedMip, ") and number of mip levels in the view (", ViewDesc.NumMipLevels, ") is out of range. The texture has only ", TexDesc.MipLevels, " mip ", (TexDesc.MipLevels > 1 ? "levels." : "level."));

    if (ViewDesc.Format == TEX_FORMAT_UNKNOWN)
        ViewDesc.Format = GetDefaultTextureViewFormat(TexDesc.Format, ViewDesc.ViewType, TexDesc.BindFlags);

    if (TexDesc.IsArray())
    {
        if (ViewDesc.FirstArraySlice >= TexDesc.ArraySize)
            TEX_VIEW_VALIDATION_ERROR("First array slice (", ViewDesc.FirstArraySlice, ") is out of range. The texture has only (", TexDesc.ArraySize, ") slices.");

        if (ViewDesc.NumArraySlices != REMAINING_ARRAY_SLICES && ViewDesc.FirstArraySlice + ViewDesc.NumArraySlices > TexDesc.ArraySize)
            TEX_VIEW_VALIDATION_ERROR("First array slice (", ViewDesc.FirstArraySlice, ") and number of array slices (", ViewDesc.NumArraySlices,
                                      ") is out of range. The texture has only (", TexDesc.ArraySize, ") slices.");
    }
    else if (!TexDesc.Is3D())
    {
        if (ViewDesc.FirstArraySlice != 0)
            TEX_VIEW_VALIDATION_ERROR("For non-array texture FirstArraySlice must be 0");
    }

    if (ViewDesc.TextureDim == RESOURCE_DIM_UNDEFINED)
    {
        if (TexDesc.Type == RESOURCE_DIM_TEX_CUBE || TexDesc.Type == RESOURCE_DIM_TEX_CUBE_ARRAY)
        {
            switch (ViewDesc.ViewType)
            {
                case TEXTURE_VIEW_SHADER_RESOURCE:
                    ViewDesc.TextureDim = TexDesc.Type;
                    break;

                case TEXTURE_VIEW_RENDER_TARGET:
                case TEXTURE_VIEW_DEPTH_STENCIL:
                case TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL:
                case TEXTURE_VIEW_UNORDERED_ACCESS:
                    ViewDesc.TextureDim = RESOURCE_DIM_TEX_2D_ARRAY;
                    break;

                default: UNEXPECTED("Unexpected view type");
            }
        }
        else
        {
            ViewDesc.TextureDim = TexDesc.Type;
        }
    }

    switch (TexDesc.Type)
    {
        case RESOURCE_DIM_TEX_1D:
            if (ViewDesc.TextureDim != RESOURCE_DIM_TEX_1D)
            {
                TEX_VIEW_VALIDATION_ERROR("Incorrect texture type for Texture 1D view: only Texture 1D is allowed.");
            }
            break;

        case RESOURCE_DIM_TEX_1D_ARRAY:
            if (ViewDesc.TextureDim != RESOURCE_DIM_TEX_1D_ARRAY &&
                ViewDesc.TextureDim != RESOURCE_DIM_TEX_1D)
            {
                TEX_VIEW_VALIDATION_ERROR("Incorrect view type for Texture 1D Array: only Texture 1D or Texture 1D Array are allowed.");
            }
            break;

        case RESOURCE_DIM_TEX_2D:
            if (ViewDesc.TextureDim != RESOURCE_DIM_TEX_2D_ARRAY &&
                ViewDesc.TextureDim != RESOURCE_DIM_TEX_2D)
            {
                TEX_VIEW_VALIDATION_ERROR("Incorrect texture type for Texture 2D view: only Texture 2D or Texture 2D Array are allowed.");
            }
            break;

        case RESOURCE_DIM_TEX_2D_ARRAY:
            if (ViewDesc.TextureDim != RESOURCE_DIM_TEX_2D_ARRAY &&
                ViewDesc.TextureDim != RESOURCE_DIM_TEX_2D)
            {
                TEX_VIEW_VALIDATION_ERROR("Incorrect texture type for Texture 2D Array view: only Texture 2D or Texture 2D Array are allowed.");
            }
            break;

        case RESOURCE_DIM_TEX_3D:
            if (ViewDesc.TextureDim != RESOURCE_DIM_TEX_3D)
            {
                TEX_VIEW_VALIDATION_ERROR("Incorrect texture type for Texture 3D view: only Texture 3D is allowed.");
            }
            break;

        case RESOURCE_DIM_TEX_CUBE:
            if (ViewDesc.ViewType == TEXTURE_VIEW_SHADER_RESOURCE)
            {
                if (ViewDesc.TextureDim != RESOURCE_DIM_TEX_2D &&
                    ViewDesc.TextureDim != RESOURCE_DIM_TEX_2D_ARRAY &&
                    ViewDesc.TextureDim != RESOURCE_DIM_TEX_CUBE)
                {
                    TEX_VIEW_VALIDATION_ERROR("Incorrect texture type for Texture cube SRV: Texture 2D, Texture 2D array or Texture Cube is allowed.");
                }
            }
            else
            {
                if (ViewDesc.TextureDim != RESOURCE_DIM_TEX_2D &&
                    ViewDesc.TextureDim != RESOURCE_DIM_TEX_2D_ARRAY)
                {
                    TEX_VIEW_VALIDATION_ERROR("Incorrect texture type for Texture cube non-shader resource view: Texture 2D or Texture 2D array is allowed.");
                }
            }
            break;

        case RESOURCE_DIM_TEX_CUBE_ARRAY:
            if (ViewDesc.ViewType == TEXTURE_VIEW_SHADER_RESOURCE)
            {
                if (ViewDesc.TextureDim != RESOURCE_DIM_TEX_2D &&
                    ViewDesc.TextureDim != RESOURCE_DIM_TEX_2D_ARRAY &&
                    ViewDesc.TextureDim != RESOURCE_DIM_TEX_CUBE &&
                    ViewDesc.TextureDim != RESOURCE_DIM_TEX_CUBE_ARRAY)
                {
                    TEX_VIEW_VALIDATION_ERROR("Incorrect texture type for Texture cube array SRV: Texture 2D, Texture 2D array, Texture Cube or Texture Cube Array is allowed.");
                }
            }
            else
            {
                if (ViewDesc.TextureDim != RESOURCE_DIM_TEX_2D &&
                    ViewDesc.TextureDim != RESOURCE_DIM_TEX_2D_ARRAY)
                {
                    TEX_VIEW_VALIDATION_ERROR("Incorrect texture type for Texture cube array non-shader resource view: Texture 2D or Texture 2D array is allowed.");
                }
            }
            break;

        default:
            UNEXPECTED("Unexpected texture type");
            break;
    }

    switch (ViewDesc.TextureDim)
    {
        case RESOURCE_DIM_TEX_CUBE:
            if (ViewDesc.ViewType != TEXTURE_VIEW_SHADER_RESOURCE)
                TEX_VIEW_VALIDATION_ERROR("Unexpected view type: SRV is expected.");
            if (ViewDesc.NumArraySlices != 6 && ViewDesc.NumArraySlices != 0 && ViewDesc.NumArraySlices != REMAINING_ARRAY_SLICES)
                TEX_VIEW_VALIDATION_ERROR("Texture cube SRV is expected to have 6 array slices, while ", ViewDesc.NumArraySlices, " is provided.");
            break;

        case RESOURCE_DIM_TEX_CUBE_ARRAY:
            if (ViewDesc.ViewType != TEXTURE_VIEW_SHADER_RESOURCE)
                TEX_VIEW_VALIDATION_ERROR("Unexpected view type: SRV is expected.");
            if (ViewDesc.NumArraySlices != REMAINING_ARRAY_SLICES && (ViewDesc.NumArraySlices % 6) != 0)
                TEX_VIEW_VALIDATION_ERROR("Number of slices in texture cube array SRV is expected to be multiple of 6. ", ViewDesc.NumArraySlices, " slices is provided.");
            break;

        case RESOURCE_DIM_TEX_1D:
        case RESOURCE_DIM_TEX_2D:
            if (ViewDesc.NumArraySlices != REMAINING_ARRAY_SLICES && ViewDesc.NumArraySlices > 1)
                TEX_VIEW_VALIDATION_ERROR("Number of slices in the view (", ViewDesc.NumArraySlices, ") must be 1 (or 0) for non-array texture 1D/2D views.");
            break;

        case RESOURCE_DIM_TEX_1D_ARRAY:
        case RESOURCE_DIM_TEX_2D_ARRAY:
            break;

        case RESOURCE_DIM_TEX_3D:
        {
            Uint32 MipDepth = std::max(TexDesc.Depth >> ViewDesc.MostDetailedMip, 1u);
            if (ViewDesc.FirstDepthSlice + ViewDesc.NumDepthSlices > MipDepth)
                TEX_VIEW_VALIDATION_ERROR("First slice (", ViewDesc.FirstDepthSlice, ") and number of slices in the view (", ViewDesc.NumDepthSlices, ") specify more slices than target 3D texture mip level has (", MipDepth, ").");
            break;
        }

        default:
            UNEXPECTED("Unexpected texture dimension");
    }

    if (GetTextureFormatAttribs(ViewDesc.Format).IsTypeless)
    {
        TEX_VIEW_VALIDATION_ERROR("Texture view format (", GetTextureFormatAttribs(ViewDesc.Format).Name, ") cannot be typeless.");
    }

    if ((ViewDesc.Flags & TEXTURE_VIEW_FLAG_ALLOW_MIP_MAP_GENERATION) != 0)
    {
        if ((TexDesc.MiscFlags & MISC_TEXTURE_FLAG_GENERATE_MIPS) == 0)
            TEX_VIEW_VALIDATION_ERROR("TEXTURE_VIEW_FLAG_ALLOW_MIP_MAP_GENERATION flag can only set if the texture was created with MISC_TEXTURE_FLAG_GENERATE_MIPS flag.");

        if (ViewDesc.ViewType != TEXTURE_VIEW_SHADER_RESOURCE)
            TEX_VIEW_VALIDATION_ERROR("TEXTURE_VIEW_FLAG_ALLOW_MIP_MAP_GENERATION flag can only be used with TEXTURE_VIEW_SHADER_RESOURCE view type.");
    }

    if (ViewDesc.ViewType == TEXTURE_VIEW_SHADING_RATE)
    {
        if ((TexDesc.BindFlags & BIND_SHADING_RATE) == 0)
            TEX_VIEW_VALIDATION_ERROR("To create TEXTURE_VIEW_SHADING_RATE, the texture must be created with BIND_SHADING_RATE flag.");
    }

    if (ViewDesc.ViewType != TEXTURE_VIEW_SHADER_RESOURCE && !IsIdentityComponentMapping(ViewDesc.Swizzle))
        TEX_VIEW_VALIDATION_ERROR("Non-identity texture component swizzle is only supported for shader resource views.");

#undef TEX_VIEW_VALIDATION_ERROR

    if (ViewDesc.NumMipLevels == 0 || ViewDesc.NumMipLevels == REMAINING_MIP_LEVELS)
    {
        if (ViewDesc.ViewType == TEXTURE_VIEW_SHADER_RESOURCE)
            ViewDesc.NumMipLevels = TexDesc.MipLevels - ViewDesc.MostDetailedMip;
        else
            ViewDesc.NumMipLevels = 1;
    }

    if (ViewDesc.NumArraySlices == 0 || ViewDesc.NumArraySlices == REMAINING_ARRAY_SLICES)
    {
        if (TexDesc.IsArray())
            ViewDesc.NumArraySlices = TexDesc.ArraySize - ViewDesc.FirstArraySlice;
        else if (TexDesc.Is3D())
        {
            Uint32 MipDepth         = std::max(TexDesc.Depth >> ViewDesc.MostDetailedMip, 1u);
            ViewDesc.NumDepthSlices = MipDepth - ViewDesc.FirstDepthSlice;
        }
        else
            ViewDesc.NumArraySlices = 1;
    }

    if ((ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET) &&
        (ViewDesc.Format == TEX_FORMAT_R8_SNORM || ViewDesc.Format == TEX_FORMAT_RG8_SNORM || ViewDesc.Format == TEX_FORMAT_RGBA8_SNORM ||
         ViewDesc.Format == TEX_FORMAT_R16_SNORM || ViewDesc.Format == TEX_FORMAT_RG16_SNORM || ViewDesc.Format == TEX_FORMAT_RGBA16_SNORM))
    {
        const char* FmtName = GetTextureFormatAttribs(ViewDesc.Format).Name;
        LOG_WARNING_MESSAGE(FmtName, " render target view is created.\n"
                                     "There might be an issue in OpenGL driver on NVidia hardware: when rendering to SNORM textures, all negative values are clamped to zero.\n"
                                     "Use UNORM format instead.");
    }
}